

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp-bare.c
# Opt level: O0

void ssh2_bare_bpp_handle_output(BinaryPacketProtocol *bpp)

{
  PktOut *pkt_00;
  PktOut *pkt;
  ssh2_bare_bpp_state *s;
  BinaryPacketProtocol *bpp_local;
  
  while( true ) {
    pkt_00 = (*(bpp->out_pq).after)(&(bpp->out_pq).pqb,(PacketQueueNode *)&bpp->out_pq,true);
    if (pkt_00 == (PktOut *)0x0) break;
    ssh2_bare_bpp_format_packet((ssh2_bare_bpp_state *)&bpp[-1].ic_in_raw,pkt_00);
    ssh_free_pktout(pkt_00);
  }
  ssh_sendbuffer_changed(bpp->ssh);
  return;
}

Assistant:

static void ssh2_bare_bpp_handle_output(BinaryPacketProtocol *bpp)
{
    struct ssh2_bare_bpp_state *s =
        container_of(bpp, struct ssh2_bare_bpp_state, bpp);
    PktOut *pkt;

    while ((pkt = pq_pop(&s->bpp.out_pq)) != NULL) {
        ssh2_bare_bpp_format_packet(s, pkt);
        ssh_free_pktout(pkt);
    }

    ssh_sendbuffer_changed(bpp->ssh);
}